

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2table.cpp
# Opt level: O0

int __thiscall QuantNet::get_conv_bottom_blob_names(QuantNet *this)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  reference ppLVar4;
  reference pvVar5;
  reference pvVar6;
  long in_RDI;
  string bottom_blob_name;
  string name;
  Layer *layer;
  size_t i;
  mapped_type *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  string local_58 [16];
  key_type *in_stack_ffffffffffffffb8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffffc0;
  string local_38 [32];
  value_type local_18;
  ulong local_10;
  
  for (local_10 = 0; uVar1 = local_10,
      sVar3 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                        ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40)),
      uVar1 < sVar3; local_10 = local_10 + 1) {
    ppLVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                        ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
                         local_10);
    local_18 = *ppLVar4;
    bVar2 = std::operator==(in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78);
    if (((bVar2) ||
        (bVar2 = std::operator==(in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78), bVar2
        )) || (bVar2 = std::operator==(in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78),
              bVar2)) {
      std::__cxx11::string::string(local_38,(string *)&local_18->name);
      in_stack_ffffffffffffff80 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x28);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_18->bottoms,0);
      pvVar6 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                         ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                          in_stack_ffffffffffffff80,(long)*pvVar5);
      std::__cxx11::string::string(local_58,(string *)pvVar6);
      in_stack_ffffffffffffff78 =
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      std::__cxx11::string::operator=((string *)in_stack_ffffffffffffff78,local_58);
      std::__cxx11::string::~string(local_58);
      std::__cxx11::string::~string(local_38);
    }
  }
  return 0;
}

Assistant:

int QuantNet::get_conv_bottom_blob_names()
{
    // find conv bottom name or index
    for (size_t i=0; i<layers.size(); i++)
    {
        ncnn::Layer* layer = layers[i];
        
        if (layer->type == "Convolution" || layer->type == "ConvolutionDepthWise" || layer->type == "InnerProduct")
        {
            std::string name = layer->name;
            std::string bottom_blob_name = blobs[layer->bottoms[0]].name;
            conv_bottom_blob_names[name] = bottom_blob_name;
        }
    }

    return 0;
}